

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coleitr.cpp
# Opt level: O0

void __thiscall
icu_63::CollationElementIterator::CollationElementIterator
          (CollationElementIterator *this,CharacterIterator *source,RuleBasedCollator *coll,
          UErrorCode *status)

{
  UErrorCode *status_local;
  RuleBasedCollator *coll_local;
  CharacterIterator *source_local;
  CollationElementIterator *this_local;
  
  UObject::UObject(&this->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__CollationElementIterator_004edbc0;
  this->iter_ = (CollationIterator *)0x0;
  this->rbc_ = coll;
  this->otherHalf_ = 0;
  this->dir_ = '\0';
  this->offsets_ = (UVector32 *)0x0;
  UnicodeString::UnicodeString(&this->string_);
  setText(this,source,status);
  return;
}

Assistant:

CollationElementIterator::CollationElementIterator(
                                           const CharacterIterator &source,
                                           const RuleBasedCollator *coll,
                                           UErrorCode &status)
        : iter_(NULL), rbc_(coll), otherHalf_(0), dir_(0), offsets_(NULL) {
    // We only call source.getText() which should be const anyway.
    setText(const_cast<CharacterIterator &>(source), status);
}